

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode on_resp_header(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts,char *header)

{
  _Bool _Var1;
  int iVar2;
  char *auth_00;
  char *auth;
  _Bool proxy;
  SingleRequest *k;
  CURLcode result;
  char *header_local;
  h1_tunnel_state_conflict *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  k._4_4_ = CURLE_OK;
  iVar2 = curl_strnequal(header,"WWW-Authenticate:",0x11);
  if (((iVar2 == 0) || ((data->req).httpcode != 0x191)) &&
     ((iVar2 = curl_strnequal(header,"Proxy-authenticate:",0x13), iVar2 == 0 ||
      ((data->req).httpcode != 0x197)))) {
    iVar2 = curl_strnequal(header,"Content-Length:",0xf);
    if (iVar2 == 0) {
      _Var1 = Curl_compareheader(header,"Connection:",0xb,"close",5);
      if (_Var1) {
        ts->field_0x11c = ts->field_0x11c & 0xfd | 2;
      }
      else {
        iVar2 = curl_strnequal(header,"Transfer-Encoding:",0x12);
        if (iVar2 == 0) {
          _Var1 = Curl_compareheader(header,"Proxy-Connection:",0x11,"close",5);
          if (_Var1) {
            ts->field_0x11c = ts->field_0x11c & 0xfd | 2;
          }
          else {
            iVar2 = strncmp(header,"HTTP/1.",7);
            if (((((iVar2 == 0) && ((header[7] == '0' || (header[7] == '1')))) && (header[8] == ' ')
                 ) && (('/' < header[9] && (header[9] < ':')))) &&
               ((('/' < header[10] &&
                 (((header[10] < ':' && ('/' < header[0xb])) && (header[0xb] < ':')))) &&
                ((header[0xc] < '0' || ('9' < header[0xc])))))) {
              iVar2 = (header[9] + -0x30) * 100 + (header[10] + -0x30) * 10 + header[0xb] + -0x30;
              (data->req).httpcode = iVar2;
              (data->info).httpproxycode = iVar2;
            }
          }
        }
        else if ((data->req).httpcode / 100 == 2) {
          if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          {
            Curl_infof(data,"Ignoring Transfer-Encoding in CONNECT %03d response",
                       (ulong)(uint)(data->req).httpcode);
          }
        }
        else {
          _Var1 = Curl_compareheader(header,"Transfer-Encoding:",0x12,"chunked",7);
          if (_Var1) {
            if ((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
              Curl_infof(data,"CONNECT responded chunked");
            }
            ts->field_0x11c = ts->field_0x11c & 0xfe | 1;
            Curl_httpchunk_reset(data,&ts->ch,true);
          }
        }
      }
    }
    else if ((data->req).httpcode / 100 == 2) {
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"Ignoring Content-Length in CONNECT %03d response",
                   (ulong)(uint)(data->req).httpcode);
      }
    }
    else {
      curlx_strtoofft(header + 0xf,(char **)0x0,10,&ts->cl);
    }
  }
  else {
    iVar2 = (data->req).httpcode;
    auth_00 = Curl_copy_header_value(header);
    if (auth_00 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",header);
    }
    k._4_4_ = Curl_http_input_auth(data,iVar2 == 0x197,auth_00);
    (*Curl_cfree)(auth_00);
    if (k._4_4_ != CURLE_OK) {
      return k._4_4_;
    }
  }
  return k._4_4_;
}

Assistant:

static CURLcode on_resp_header(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               struct h1_tunnel_state *ts,
                               const char *header)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  (void)cf;

  if((checkprefix("WWW-Authenticate:", header) &&
      (401 == k->httpcode)) ||
     (checkprefix("Proxy-authenticate:", header) &&
      (407 == k->httpcode))) {

    bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
    char *auth = Curl_copy_header_value(header);
    if(!auth)
      return CURLE_OUT_OF_MEMORY;

    CURL_TRC_CF(data, cf, "CONNECT: fwd auth header '%s'", header);
    result = Curl_http_input_auth(data, proxy, auth);

    free(auth);

    if(result)
      return result;
  }
  else if(checkprefix("Content-Length:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Content-Length in CONNECT %03d response",
            k->httpcode);
    }
    else {
      (void)curlx_strtoofft(header + strlen("Content-Length:"),
                            NULL, 10, &ts->cl);
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Connection:"), STRCONST("close")))
    ts->close_connection = TRUE;
  else if(checkprefix("Transfer-Encoding:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Transfer-Encoding in "
            "CONNECT %03d response", k->httpcode);
    }
    else if(Curl_compareheader(header,
                               STRCONST("Transfer-Encoding:"),
                               STRCONST("chunked"))) {
      infof(data, "CONNECT responded chunked");
      ts->chunked_encoding = TRUE;
      /* reset our chunky engine */
      Curl_httpchunk_reset(data, &ts->ch, TRUE);
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Proxy-Connection:"),
                             STRCONST("close")))
    ts->close_connection = TRUE;
  else if(!strncmp(header, "HTTP/1.", 7) &&
          ((header[7] == '0') || (header[7] == '1')) &&
          (header[8] == ' ') &&
          ISDIGIT(header[9]) && ISDIGIT(header[10]) && ISDIGIT(header[11]) &&
          !ISDIGIT(header[12])) {
    /* store the HTTP code from the proxy */
    data->info.httpproxycode =  k->httpcode = (header[9] - '0') * 100 +
      (header[10] - '0') * 10 + (header[11] - '0');
  }
  return result;
}